

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

int __thiscall
QtPrivate::QGenericArrayOps<QCursor>::truncate
          (QGenericArrayOps<QCursor> *this,char *__file,__off_t __length)

{
  QCursor *pQVar1;
  int extraout_EAX;
  
  pQVar1 = (this->super_QArrayDataPointer<QCursor>).ptr;
  std::_Destroy_aux<false>::__destroy<QCursor*>
            (pQVar1 + (long)__file,pQVar1 + (this->super_QArrayDataPointer<QCursor>).size);
  (this->super_QArrayDataPointer<QCursor>).size = (qsizetype)__file;
  return extraout_EAX;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }